

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

UChar32 __thiscall icu_63::RBBIRuleScanner::nextCharLL(RBBIRuleScanner *this)

{
  short sVar1;
  UnicodeString *this_00;
  UChar32 UVar2;
  int32_t iVar3;
  
  this_00 = this->fRB->fRules;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 <= this->fNextIndex) {
    return -1;
  }
  UVar2 = UnicodeString::char32At(this_00,this->fNextIndex);
  iVar3 = UnicodeString::moveIndex32(this->fRB->fRules,this->fNextIndex,1);
  this->fNextIndex = iVar3;
  if (((UVar2 != 0x2028) && (UVar2 != 0xd)) && (UVar2 != 0x85)) {
    if (UVar2 != 10) {
      this->fCharNum = this->fCharNum + 1;
      goto LAB_00297d93;
    }
    if (this->fLastChar == 0xd) goto LAB_00297d93;
  }
  this->fLineNum = this->fLineNum + 1;
  this->fCharNum = 0;
  if (this->fQuoteMode != '\0') {
    error(this,U_BRK_NEW_LINE_IN_QUOTED_STRING);
    this->fQuoteMode = '\0';
  }
LAB_00297d93:
  this->fLastChar = UVar2;
  return UVar2;
}

Assistant:

UChar32  RBBIRuleScanner::nextCharLL() {
    UChar32  ch;

    if (fNextIndex >= fRB->fRules.length()) {
        return (UChar32)-1;
    }
    ch         = fRB->fRules.char32At(fNextIndex);
    fNextIndex = fRB->fRules.moveIndex32(fNextIndex, 1);

    if (ch == chCR ||
        ch == chNEL ||
        ch == chLS   ||
        (ch == chLF && fLastChar != chCR)) {
        // Character is starting a new line.  Bump up the line number, and
        //  reset the column to 0.
        fLineNum++;
        fCharNum=0;
        if (fQuoteMode) {
            error(U_BRK_NEW_LINE_IN_QUOTED_STRING);
            fQuoteMode = FALSE;
        }
    }
    else {
        // Character is not starting a new line.  Except in the case of a
        //   LF following a CR, increment the column position.
        if (ch != chLF) {
            fCharNum++;
        }
    }
    fLastChar = ch;
    return ch;
}